

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaParseUInt(xmlChar **str,unsigned_long *llo,unsigned_long *lmi,unsigned_long *lhi)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  unsigned_long uVar4;
  byte *pbVar5;
  byte *pbVar6;
  unsigned_long uVar7;
  int iVar8;
  uint uVar9;
  unsigned_long uVar10;
  
  uVar3 = 0xfffffffe;
  if ((byte)(**str - 0x30) < 10) {
    pbVar5 = *str + -1;
    do {
      pbVar6 = pbVar5 + 1;
      pbVar5 = pbVar5 + 1;
    } while (*pbVar6 == 0x30);
    uVar3 = 0;
    pbVar6 = pbVar5;
    if ((byte)(*pbVar5 - 0x30) < 10) {
      uVar3 = 0;
      do {
        uVar3 = uVar3 + 1;
        pbVar1 = pbVar6 + 1;
        pbVar6 = pbVar6 + 1;
      } while ((byte)(*pbVar1 - 0x30) < 10);
    }
    if (uVar3 < 0x19) {
      if ((int)uVar3 < 0x11) {
        uVar7 = 0;
        uVar9 = uVar3;
      }
      else {
        iVar8 = uVar3 + 1;
        uVar7 = 0;
        do {
          bVar2 = *pbVar5;
          pbVar5 = pbVar5 + 1;
          uVar7 = ((ulong)bVar2 + uVar7 * 10) - 0x30;
          iVar8 = iVar8 + -1;
        } while (0x11 < iVar8);
        uVar9 = 0x10;
      }
      if ((int)uVar9 < 9) {
        uVar10 = 0;
      }
      else {
        iVar8 = uVar9 + 1;
        uVar10 = 0;
        pbVar6 = pbVar5;
        do {
          bVar2 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar10 = ((ulong)bVar2 + uVar10 * 10) - 0x30;
          iVar8 = iVar8 + -1;
        } while (9 < iVar8);
        pbVar5 = pbVar5 + (ulong)(uVar9 - 9) + 1;
        uVar9 = 8;
      }
      if ((int)uVar9 < 1) {
        uVar4 = 0;
      }
      else {
        iVar8 = uVar9 + 1;
        uVar4 = 0;
        pbVar6 = pbVar5;
        do {
          bVar2 = *pbVar6;
          pbVar6 = pbVar6 + 1;
          uVar4 = ((ulong)bVar2 + uVar4 * 10) - 0x30;
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
        pbVar5 = pbVar5 + uVar9;
      }
      *str = pbVar5;
      *llo = uVar4;
      *lmi = uVar10;
      *lhi = uVar7;
    }
    else {
      *str = pbVar6;
      uVar3 = 0xffffffff;
    }
  }
  return uVar3;
}

Assistant:

static int
xmlSchemaParseUInt(const xmlChar **str, unsigned long *llo,
                   unsigned long *lmi, unsigned long *lhi) {
    unsigned long lo = 0, mi = 0, hi = 0;
    const xmlChar *tmp, *cur = *str;
    int ret = 0, i = 0;

    if (!((*cur >= '0') && (*cur <= '9')))
        return(-2);

    while (*cur == '0') {        /* ignore leading zeroes */
        cur++;
    }
    tmp = cur;
    while ((*tmp != 0) && (*tmp >= '0') && (*tmp <= '9')) {
        i++;tmp++;ret++;
    }
    if (i > 24) {
        *str = tmp;
        return(-1);
    }
    while (i > 16) {
        hi = hi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 8) {
        mi = mi * 10 + (*cur++ - '0');
        i--;
    }
    while (i > 0) {
        lo = lo * 10 + (*cur++ - '0');
        i--;
    }

    *str = cur;
    *llo = lo;
    *lmi = mi;
    *lhi = hi;
    return(ret);
}